

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer_TwoLevelShm.cpp
# Opt level: O1

void __thiscall
adios2::core::engine::BP5Writer::WriteData_TwoLevelShm(BP5Writer *this,BufferV *Data)

{
  uint64_t *buf;
  Comm *this_00;
  ulong uVar1;
  int iVar2;
  int iVar3;
  MPIShmChain *this_01;
  uint64_t uVar4;
  pointer puVar5;
  unsigned_long *puVar6;
  uint64_t uVar7;
  size_t alignment_size;
  ulong blocksize;
  long lVar8;
  MPIShmChain *this_02;
  uint64_t nextWriterPos_3;
  uint64_t nextWriterPos_1;
  TokenChain<unsigned_long> tokenChain;
  uint64_t nextWriterPos;
  vector<unsigned_long,_std::allocator<unsigned_long>_> mySizes;
  string local_c0;
  MPIShmChain *local_a0;
  Comm local_98;
  Comm local_90;
  Status local_88;
  TokenChain<unsigned_long> local_70;
  unsigned_long local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  if (this->m_Aggregator == (MPIAggregator *)0x0) {
    this_01 = (MPIShmChain *)0x0;
  }
  else {
    this_01 = (MPIShmChain *)
              __dynamic_cast(this->m_Aggregator,&aggregator::MPIAggregator::typeinfo,
                             &aggregator::MPIShmChain::typeinfo);
  }
  uVar4 = helper::PaddingToAlignOffset
                    (this->m_DataPos,(ulong)(this->super_BP5Engine).m_Parameters.StripeSize);
  this->m_DataPos = this->m_DataPos + uVar4;
  this_02 = (MPIShmChain *)&(this_01->super_MPIAggregator).m_Comm;
  uVar4 = adios2::format::BufferV::Size(Data);
  blocksize = 0;
  helper::Comm::GatherValues<unsigned_long>(&local_48,(Comm *)this_02,uVar4,0);
  lVar8 = 0;
  if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    blocksize = 0;
    puVar5 = local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      uVar1 = *puVar5;
      lVar8 = lVar8 + uVar1;
      if (blocksize < uVar1) {
        blocksize = uVar1;
      }
      puVar5 = puVar5 + 1;
    } while (puVar5 != local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  iVar2 = helper::Comm::Size((Comm *)this_02);
  if (1 < iVar2) {
    alignment_size = 0x20;
    if ((this->super_BP5Engine).m_Parameters.DirectIO != false) {
      alignment_size = (ulong)(this->super_BP5Engine).m_Parameters.DirectIOAlignOffset;
    }
    aggregator::MPIShmChain::CreateShm
              (this_01,blocksize,(this->super_BP5Engine).m_Parameters.MaxShmSize,alignment_size);
  }
  shm::TokenChain<unsigned_long>::TokenChain(&local_70,(Comm *)this_02);
  if ((this_01->super_MPIAggregator).m_IsAggregator != true) {
    puVar6 = shm::TokenChain<unsigned_long>::RecvToken(&local_70);
    this->m_StartDataPos = *puVar6;
    SendDataToAggregator(this,Data);
    uVar4 = this->m_StartDataPos;
    uVar7 = adios2::format::BufferV::Size(Data);
    local_c0._M_dataplus._M_p = (pointer)(uVar7 + uVar4);
    shm::TokenChain<unsigned_long>::SendToken(&local_70,(unsigned_long *)&local_c0);
    goto LAB_0048b8d4;
  }
  this_00 = &this_01->m_AggregatorChainComm;
  iVar2 = helper::Comm::Rank(this_00);
  buf = &this->m_DataPos;
  if (0 < iVar2) {
    iVar2 = helper::Comm::Rank(this_00);
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    local_a0 = this_02;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,"AggregatorChain token in BP5Writer::WriteData_TwoLevelShm","");
    helper::Comm::Recv<unsigned_long>(&local_88,this_00,buf,1,iVar2 + -1,0,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    uVar4 = helper::PaddingToAlignOffset
                      (this->m_DataPos,(ulong)(this->super_BP5Engine).m_Parameters.StripeSize);
    *buf = *buf + uVar4;
    this_02 = local_a0;
  }
  this->m_StartDataPos = this->m_DataPos;
  iVar2 = helper::Comm::Rank(this_00);
  iVar3 = helper::Comm::Size(this_00);
  if (iVar2 < iVar3 + -1) {
    local_88._0_8_ = *buf + lVar8;
    local_a0 = this_01;
    iVar2 = helper::Comm::Rank(this_00);
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,"Chain token in BP5Writer::WriteData","");
    helper::Comm::Isend<unsigned_long>
              (&local_90,(unsigned_long *)this_00,(size_t)&local_88,1,iVar2 + 1,(string *)0x0);
    helper::Comm::Req::~Req((Req *)&local_90);
    this_01 = local_a0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
LAB_0048b7f3:
      operator_delete(local_c0._M_dataplus._M_p);
    }
  }
  else {
    iVar2 = helper::Comm::Size(this_00);
    if (1 < iVar2) {
      local_88._0_8_ = *buf + lVar8;
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,"Chain token in BP5Writer::WriteData","");
      helper::Comm::Isend<unsigned_long>
                (&local_98,(unsigned_long *)this_00,(size_t)&local_88,1,0,(string *)0x0);
      helper::Comm::Req::~Req((Req *)&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) goto LAB_0048b7f3;
    }
  }
  uVar4 = *buf;
  uVar7 = adios2::format::BufferV::Size(Data);
  local_50 = uVar7 + uVar4;
  shm::TokenChain<unsigned_long>::SendToken(&local_70,&local_50);
  WriteMyOwnData(this,Data);
  iVar2 = helper::Comm::Size((Comm *)this_02);
  if (1 < iVar2) {
    uVar4 = adios2::format::BufferV::Size(Data);
    WriteOthersData(this,lVar8 - uVar4);
  }
  iVar2 = helper::Comm::Size(this_00);
  if ((1 < iVar2) && (iVar2 = helper::Comm::Rank(this_00), iVar2 == 0)) {
    iVar2 = helper::Comm::Size(this_00);
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,"Chain token in BP5Writer::WriteData","");
    helper::Comm::Recv<unsigned_long>(&local_88,this_00,buf,1,iVar2 + -1,0,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
  }
LAB_0048b8d4:
  iVar2 = helper::Comm::Size((Comm *)this_02);
  if (1 < iVar2) {
    aggregator::MPIShmChain::DestroyShm(this_01);
  }
  shm::TokenChain<unsigned_long>::~TokenChain(&local_70);
  if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (ulong *)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void BP5Writer::WriteData_TwoLevelShm(format::BufferV *Data)
{
    aggregator::MPIShmChain *a = dynamic_cast<aggregator::MPIShmChain *>(m_Aggregator);

    // new step writing starts at offset m_DataPos on master aggregator
    // other aggregators to the same file will need to wait for the position
    // to arrive from the rank below

    // align to PAGE_SIZE (only valid on master aggregator at this point)
    m_DataPos += helper::PaddingToAlignOffset(m_DataPos, m_Parameters.StripeSize);

    // Each aggregator needs to know the total size they write
    // This calculation is valid on aggregators only
    std::vector<uint64_t> mySizes = a->m_Comm.GatherValues(Data->Size());
    uint64_t myTotalSize = 0;
    uint64_t maxSize = 0;
    for (auto s : mySizes)
    {
        myTotalSize += s;
        if (s > maxSize)
        {
            maxSize = s;
        }
    }

    if (a->m_Comm.Size() > 1)
    {
        size_t alignment_size = sizeof(max_align_t);
        if (m_Parameters.DirectIO)
        {
            alignment_size = m_Parameters.DirectIOAlignOffset;
        }
        a->CreateShm(static_cast<size_t>(maxSize), m_Parameters.MaxShmSize, alignment_size);
    }

    shm::TokenChain<uint64_t> tokenChain(&a->m_Comm);

    if (a->m_IsAggregator)
    {
        // In each aggregator chain, send from master down the line
        // these total sizes, so every aggregator knows where to start
        if (a->m_AggregatorChainComm.Rank() > 0)
        {
            a->m_AggregatorChainComm.Recv(
                &m_DataPos, 1, a->m_AggregatorChainComm.Rank() - 1, 0,
                "AggregatorChain token in BP5Writer::WriteData_TwoLevelShm");
            // align to PAGE_SIZE
            m_DataPos += helper::PaddingToAlignOffset(m_DataPos, m_Parameters.StripeSize);
        }
        m_StartDataPos = m_DataPos; // metadata needs this info
        if (a->m_AggregatorChainComm.Rank() < a->m_AggregatorChainComm.Size() - 1)
        {
            uint64_t nextWriterPos = m_DataPos + myTotalSize;
            a->m_AggregatorChainComm.Isend(&nextWriterPos, 1, a->m_AggregatorChainComm.Rank() + 1,
                                           0, "Chain token in BP5Writer::WriteData");
        }
        else if (a->m_AggregatorChainComm.Size() > 1)
        {
            // send back final position from last aggregator in file to master
            // aggregator
            uint64_t nextWriterPos = m_DataPos + myTotalSize;
            a->m_AggregatorChainComm.Isend(&nextWriterPos, 1, 0, 0,
                                           "Chain token in BP5Writer::WriteData");
        }

        /*std::cout << "Rank " << m_Comm.Rank()
                  << " aggregator start writing step " << m_WriterStep
                  << " to subfile " << a->m_SubStreamIndex << " at pos "
                  << m_DataPos << " totalsize " << myTotalSize << std::endl;*/

        // Send token to first non-aggregator to start filling shm
        // Also informs next process its starting offset (for correct metadata)
        uint64_t nextWriterPos = m_DataPos + Data->Size();
        tokenChain.SendToken(nextWriterPos);

        WriteMyOwnData(Data);

        /* Write from shm until every non-aggr sent all data */
        if (a->m_Comm.Size() > 1)
        {
            WriteOthersData(myTotalSize - Data->Size());
        }

        // Master aggregator needs to know where the last writing ended by the
        // last aggregator in the chain, so that it can start from the correct
        // position at the next output step
        if (a->m_AggregatorChainComm.Size() > 1 && !a->m_AggregatorChainComm.Rank())
        {
            a->m_AggregatorChainComm.Recv(&m_DataPos, 1, a->m_AggregatorChainComm.Size() - 1, 0,
                                          "Chain token in BP5Writer::WriteData");
        }
    }
    else
    {
        // non-aggregators fill shared buffer in marching order
        // they also receive their starting offset this way
        m_StartDataPos = tokenChain.RecvToken();

        /*std::cout << "Rank " << m_Comm.Rank()
                  << " non-aggregator recv token to fill shm = "
                  << m_StartDataPos << std::endl;*/

        SendDataToAggregator(Data);

        uint64_t nextWriterPos = m_StartDataPos + Data->Size();
        tokenChain.SendToken(nextWriterPos);
    }

    if (a->m_Comm.Size() > 1)
    {
        a->DestroyShm();
    }
}